

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

size_t qHash<std::pair<QString,QString>>(QList<std::pair<QString,_QString>_> *key,size_t seed)

{
  long lVar1;
  QHashMultiReturnType<QString,_QString> QVar2;
  pair<QString,_QString> *args;
  pair<QString,_QString> *ppVar3;
  
  lVar1 = (key->d).size;
  if (lVar1 != 0) {
    args = (key->d).ptr;
    ppVar3 = args + lVar1;
    do {
      QVar2 = qHashMulti<QString,QString>(0,&args->first,&args->second);
      seed = seed ^ (seed >> 2) + seed * 0x40 + QVar2 + 0x9e3779b9;
      args = args + 1;
    } while (args != ppVar3);
  }
  return seed;
}

Assistant:

size_t qHash(const QList<T> &key, size_t seed = 0)
    noexcept(noexcept(qHashRange(key.cbegin(), key.cend(), seed)))
{
    return qHashRange(key.cbegin(), key.cend(), seed);
}